

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiNavLayer in_EDI;
  ImGuiWindow *window;
  ImGuiWindow *prev_nav_window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (in_EDI == ImGuiNavLayer_Main) {
    pIVar1 = GImGui->NavWindow;
    pIVar3 = NavRestoreLastChildNavWindow(GImGui->NavWindow);
    pIVar2->NavWindow = pIVar3;
    if ((pIVar1 != (ImGuiWindow *)0x0) && ((pIVar2->DebugLogFlags & 2U) != 0)) {
      DebugLog("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n",pIVar1->Name,
               pIVar2->NavWindow->Name);
    }
  }
  pIVar1 = pIVar2->NavWindow;
  if (pIVar1->NavLastIds[in_EDI] == 0) {
    pIVar2->NavLayer = in_EDI;
    NavInitWindow(prev_nav_window,window._7_1_);
  }
  else {
    SetNavID(pIVar1->NavLastIds[in_EDI],in_EDI,0,pIVar1->NavRectRel + in_EDI);
  }
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
    {
        ImGuiWindow* prev_nav_window = g.NavWindow;
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);    // FIXME-NAV: Should clear ongoing nav requests?
        if (prev_nav_window)
            IMGUI_DEBUG_LOG_FOCUS("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n", prev_nav_window->Name, g.NavWindow->Name);
    }
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}